

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.cpp
# Opt level: O1

var __thiscall cs::function::call_rl(function *this,function *_this,vector *args)

{
  undefined *puVar1;
  runtime_error *this_00;
  long *plVar2;
  size_type *psVar3;
  pointer paVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  scope_guard scope;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110 [4];
  string local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  puVar1 = current_process;
  if ((*current_process & 1) != 0) {
    LOCK();
    *current_process = 0;
    UNLOCK();
    event_type::touch((event_type *)(puVar1 + 0xd0),(void *)0x0);
  }
  if ((long)(args->super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(args->super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
            super__Vector_impl_data._M_start >> 3 ==
      (long)(_this->mArgs).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)(_this->mArgs).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start >> 5) {
    local_110[0]._M_dataplus._M_p = (pointer)_this;
    domain_manager::add_domain
              (&(((((_this->mContext).
                    super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  instance).super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                 )->super_runtime_type).storage);
    paVar4 = (args->super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((args->super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
        super__Vector_impl_data._M_finish != paVar4) {
      lVar6 = 0;
      lVar7 = 0;
      uVar5 = 0;
      do {
        domain_manager::add_var_no_return<std::__cxx11::string_const&>
                  (&(((((_this->mContext).
                        super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                      instance).super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->super_runtime_type).storage,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&(((_this->mArgs).
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar7),
                   (var *)((long)&paVar4->mDat + lVar6));
        uVar5 = uVar5 + 1;
        paVar4 = (args->super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        lVar7 = lVar7 + 0x20;
        lVar6 = lVar6 + 8;
      } while (uVar5 < (ulong)((long)(args->
                                     super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>
                                     )._M_impl.super__Vector_impl_data._M_finish - (long)paVar4 >> 3
                              ));
    }
    local_130._M_dataplus._M_p =
         (pointer)(*(_this->mBody).
                    super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>.
                    _M_impl.super__Deque_impl_data._M_start._M_cur)[1]._vptr_statement_base;
    runtime_type::parse_expr
              ((runtime_type *)this,
               (iterator *)
               (((_this->mContext).super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->instance).super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr,SUB81(&local_130,0));
    scope_guard::~scope_guard((scope_guard *)local_110);
    return (var)(proxy *)this;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x28);
  std::__cxx11::to_string
            (&local_70,
             (long)(_this->mArgs).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(_this->mArgs).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 5);
  std::operator+(&local_50,"Wrong size of arguments. Expected ",&local_70);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_50);
  local_130._M_dataplus._M_p = (pointer)*plVar2;
  psVar3 = (size_type *)(plVar2 + 2);
  if ((size_type *)local_130._M_dataplus._M_p == psVar3) {
    local_130.field_2._M_allocated_capacity = *psVar3;
    local_130.field_2._8_8_ = plVar2[3];
    local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
  }
  else {
    local_130.field_2._M_allocated_capacity = *psVar3;
  }
  local_130._M_string_length = plVar2[1];
  *plVar2 = (long)psVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  std::__cxx11::to_string
            (&local_90,
             (long)(args->super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(args->super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 3);
  std::operator+(local_110,&local_130,&local_90);
  runtime_error::runtime_error(this_00,local_110);
  __cxa_throw(this_00,&runtime_error::typeinfo,runtime_error::~runtime_error);
}

Assistant:

var function::call_rl(const function *_this, vector &args)
	{
		current_process->poll_event();
		if (args.size() != _this->mArgs.size())
			throw runtime_error(
			    "Wrong size of arguments. Expected " + std::to_string(_this->mArgs.size()) + ", provided " +
			    std::to_string(args.size()));
		scope_guard scope(_this->mContext);
#ifdef CS_DEBUGGER
		fcall_guard fcall(_this->mDecl);
		if(_this->mMatch)
			cs_debugger_func_callback(_this->mDecl, _this->mStmt);
#endif
		for (std::size_t i = 0; i < args.size(); ++i)
			_this->mContext->instance->storage.add_var_no_return(_this->mArgs[i], args[i]);
		try {
			return _this->mContext->instance->parse_expr(static_cast<const statement_return *>(_this->mBody.front())->get_tree().root());
		}
		catch (const cs::exception &e) {
			throw e;
		}
		catch (const std::exception &e) {
			const statement_base *ptr = _this->mBody.front();
			throw exception(ptr->get_line_num(), ptr->get_file_path(), ptr->get_raw_code(), e.what());
		}
	}